

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetColumnWidth(int column_index,float width)

{
  ImGuiColumnsSet *pIVar1;
  float fVar2;
  
  pIVar1 = (GImGui->CurrentWindow->DC).ColumnsSet;
  if (pIVar1 != (ImGuiColumnsSet *)0x0) {
    if (column_index < 0) {
      column_index = pIVar1->Current;
    }
    fVar2 = GetColumnOffset(column_index);
    SetColumnOffset(column_index + 1,fVar2 + width);
    return;
  }
  __assert_fail("columns != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x3231,"void ImGui::SetColumnWidth(int, float)");
}

Assistant:

void ImGui::SetColumnWidth(int column_index, float width)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiColumnsSet* columns = window->DC.ColumnsSet;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    SetColumnOffset(column_index + 1, GetColumnOffset(column_index) + width);
}